

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::GenTableAccessorFuncReturnType
          (string *__return_storage_ptr__,RustGenerator *this,FieldDef *field,string *lifetime)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  FullType FVar1;
  allocator<char> local_569;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  undefined1 local_428 [8];
  string typname_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [8];
  string typname_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [8];
  string typname_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  Type local_248;
  undefined1 local_228 [8];
  string typname_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string typname_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string typname;
  string local_58;
  FieldDef *local_38;
  anon_class_8_1_a7e8901a WrapOption;
  Type *type;
  string *lifetime_local;
  FieldDef *field_local;
  RustGenerator *this_local;
  
  WrapOption.field = (FieldDef *)&field->value;
  local_38 = field;
  FVar1 = anon_unknown_26::GetFullType(&(field->value).type);
  switch(FVar1) {
  case ftInteger:
  case ftFloat:
  case ftBool:
    GetTypeBasic_abi_cxx11_(&local_58,this,(Type *)WrapOption.field);
    GenTableAccessorFuncReturnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    break;
  case ftStruct:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_88,this,
               (Definition *)((WrapOption.field)->super_Definition).name._M_string_length);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_1.field_2 + 8),"&",lifetime);
    std::operator+(&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_1.field_2 + 8)," ");
    std::operator+(&local_a8,&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    GenTableAccessorFuncReturnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&local_38,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)(typname_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_88);
    break;
  case ftTable:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_108,this,
               (Definition *)((WrapOption.field)->super_Definition).name._M_string_length);
    std::operator+(&local_168,(string *)local_108,"<");
    std::operator+(&local_148,&local_168,lifetime);
    std::operator+(&local_128,&local_148,">");
    GenTableAccessorFuncReturnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&local_38,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)local_108);
    break;
  case ftEnumKey:
  case ftUnionKey:
    WrapInNameSpace_abi_cxx11_
              (&local_188,this,
               (Definition *)
               ((WrapOption.field)->super_Definition).name.field_2._M_allocated_capacity);
    GenTableAccessorFuncReturnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&local_38,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    break;
  case ftUnionValue:
    std::operator+(&local_1c8,"flatbuffers::Table<",lifetime);
    std::operator+(&local_1a8,&local_1c8,">");
    GenTableAccessorFuncReturnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&local_38,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    break;
  case ftString:
    __return_storage_ptr___00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&typname_2.field_2 + 8);
    std::operator+(__return_storage_ptr___00,"&",lifetime);
    std::operator+(&local_1e8,__return_storage_ptr___00," str");
    GenTableAccessorFuncReturnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&local_38,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)(typname_2.field_2._M_local_buf + 8));
    break;
  case ftVectorOfInteger:
  case ftVectorOfFloat:
  case ftVectorOfBool:
    Type::VectorType(&local_248,(Type *)WrapOption.field);
    GetTypeBasic_abi_cxx11_((string *)local_228,this,&local_248);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_3.field_2 + 8),"flatbuffers::Vector<",lifetime);
    std::operator+(&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_3.field_2 + 8),", ");
    std::operator+(&local_288,&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    std::operator+(&local_268,&local_288,">");
    GenTableAccessorFuncReturnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&local_38,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)(typname_3.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_228);
    break;
  case ftVectorOfEnumKey:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_2e8,this,
               (Definition *)
               ((WrapOption.field)->super_Definition).name.field_2._M_allocated_capacity);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_4.field_2 + 8),"flatbuffers::Vector<",lifetime);
    std::operator+(&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_4.field_2 + 8),", ");
    std::operator+(&local_328,&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    std::operator+(&local_308,&local_328,">");
    GenTableAccessorFuncReturnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&local_38,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)(typname_4.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_2e8);
    break;
  case ftVectorOfStruct:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_388,this,
               (Definition *)((WrapOption.field)->super_Definition).name._M_string_length);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_5.field_2 + 8),"flatbuffers::Vector<",lifetime);
    std::operator+(&local_3e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_5.field_2 + 8),", ");
    std::operator+(&local_3c8,&local_3e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
    std::operator+(&local_3a8,&local_3c8,">");
    GenTableAccessorFuncReturnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&local_38,&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)(typname_5.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_388);
    break;
  case ftVectorOfTable:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_428,this,
               (Definition *)((WrapOption.field)->super_Definition).name._M_string_length);
    std::operator+(&local_4e8,"flatbuffers::Vector<",lifetime);
    std::operator+(&local_4c8,&local_4e8,", flatbuffers::ForwardsUOffset<");
    std::operator+(&local_4a8,&local_4c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428);
    std::operator+(&local_488,&local_4a8,"<");
    std::operator+(&local_468,&local_488,lifetime);
    std::operator+(&local_448,&local_468,">>>");
    GenTableAccessorFuncReturnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&local_38,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)local_428);
    break;
  case ftVectorOfString:
    std::operator+(&local_568,"flatbuffers::Vector<",lifetime);
    std::operator+(&local_548,&local_568,", flatbuffers::ForwardsUOffset<&");
    std::operator+(&local_528,&local_548,lifetime);
    std::operator+(&local_508,&local_528," str>>");
    GenTableAccessorFuncReturnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&local_38,&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::~string((string *)&local_568);
    break;
  case ftVectorOfUnionValue:
    __assert_fail("false && \"vectors of unions are not yet supported\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x5dc,
                  "std::string flatbuffers::rust::RustGenerator::GenTableAccessorFuncReturnType(const FieldDef &, const std::string &)"
                 );
  case ftArrayOfBuiltin:
  case ftArrayOfEnum:
  case ftArrayOfStruct:
    __assert_fail("false && \"arrays are not supported within tables\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x5e4,
                  "std::string flatbuffers::rust::RustGenerator::GenTableAccessorFuncReturnType(const FieldDef &, const std::string &)"
                 );
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INVALID_CODE_GENERATION",&local_569);
    std::allocator<char>::~allocator(&local_569);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTableAccessorFuncReturnType(const FieldDef &field,
                                             const std::string &lifetime) {
    const Type &type = field.value.type;
    const auto WrapOption = [&](std::string s) {
      return field.IsOptional() ? "Option<" + s + ">" : s;
    };

    switch (GetFullType(field.value.type)) {
      case ftInteger:
      case ftFloat:
      case ftBool: {
        return WrapOption(GetTypeBasic(type));
      }
      case ftStruct: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapOption("&" + lifetime + " " + typname);
      }
      case ftTable: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapOption(typname + "<" + lifetime + ">");
      }
      case ftEnumKey:
      case ftUnionKey: {
        return WrapOption(WrapInNameSpace(*type.enum_def));
      }

      case ftUnionValue: {
        return WrapOption("flatbuffers::Table<" + lifetime + ">");
      }
      case ftString: {
        return WrapOption("&" + lifetime + " str");
      }
      case ftVectorOfInteger:
      case ftVectorOfBool:
      case ftVectorOfFloat: {
        const auto typname = GetTypeBasic(type.VectorType());
        return WrapOption("flatbuffers::Vector<" + lifetime + ", " + typname +
                          ">");
      }
      case ftVectorOfEnumKey: {
        const auto typname = WrapInNameSpace(*type.enum_def);
        return WrapOption("flatbuffers::Vector<" + lifetime + ", " + typname +
                          ">");
      }
      case ftVectorOfStruct: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapOption("flatbuffers::Vector<" + lifetime + ", " + typname +
                          ">");
      }
      case ftVectorOfTable: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapOption("flatbuffers::Vector<" + lifetime +
                          ", flatbuffers::ForwardsUOffset<" + typname + "<" +
                          lifetime + ">>>");
      }
      case ftVectorOfString: {
        return WrapOption("flatbuffers::Vector<" + lifetime +
                          ", flatbuffers::ForwardsUOffset<&" + lifetime +
                          " str>>");
      }
      case ftVectorOfUnionValue: {
        FLATBUFFERS_ASSERT(false && "vectors of unions are not yet supported");
        // TODO(rw): when we do support these, we should consider using the
        //           Into trait to convert tables to typesafe union values.
        return "INVALID_CODE_GENERATION";  // for return analysis
      }
      case ftArrayOfEnum:
      case ftArrayOfStruct:
      case ftArrayOfBuiltin: {
        FLATBUFFERS_ASSERT(false && "arrays are not supported within tables");
        return "ARRAYS_NOT_SUPPORTED_IN_TABLES";
      }
    }
    return "INVALID_CODE_GENERATION";  // for return analysis
  }